

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

xmlChar * xmlURIEscapeStr(xmlChar *str,xmlChar *list)

{
  int iVar1;
  byte bVar2;
  xmlChar *pxVar3;
  int local_48;
  int iStack_44;
  uchar val;
  int out;
  int len;
  xmlChar *in;
  xmlChar *temp;
  xmlChar *pxStack_28;
  xmlChar ch;
  xmlChar *ret;
  xmlChar *list_local;
  xmlChar *str_local;
  
  if (str == (xmlChar *)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else {
    ret = list;
    list_local = str;
    if (*str == '\0') {
      str_local = xmlStrdup(str);
    }
    else {
      iStack_44 = xmlStrlen(str);
      if (iStack_44 < 1) {
        str_local = (xmlChar *)0x0;
      }
      else {
        iStack_44 = iStack_44 + 0x14;
        pxStack_28 = (xmlChar *)(*xmlMallocAtomic)((long)iStack_44);
        if (pxStack_28 == (xmlChar *)0x0) {
          xmlURIErrMemory("escaping URI value\n");
          str_local = (xmlChar *)0x0;
        }
        else {
          local_48 = 0;
          for (_out = list_local; iVar1 = local_48, *_out != 0; _out = _out + 1) {
            pxVar3 = pxStack_28;
            if ((iStack_44 - local_48 < 4) &&
               (in = xmlSaveUriRealloc(pxStack_28,&stack0xffffffffffffffbc), pxVar3 = in,
               in == (xmlChar *)0x0)) {
              xmlURIErrMemory("escaping URI value\n");
              (*xmlFree)(pxStack_28);
              return (xmlChar *)0x0;
            }
            pxStack_28 = pxVar3;
            temp._7_1_ = *_out;
            if (((((temp._7_1_ == 0x40) || ((0x60 < temp._7_1_ && (temp._7_1_ < 0x7b)))) ||
                 ((0x40 < temp._7_1_ && (temp._7_1_ < 0x5b)))) ||
                ((((0x2f < temp._7_1_ && (temp._7_1_ < 0x3a)) || (temp._7_1_ == 0x2d)) ||
                 ((((temp._7_1_ == 0x5f || (temp._7_1_ == 0x2e)) ||
                   ((temp._7_1_ == 0x21 || ((temp._7_1_ == 0x7e || (temp._7_1_ == 0x2a)))))) ||
                  (temp._7_1_ == 0x27)))))) ||
               (((temp._7_1_ == 0x28 || (temp._7_1_ == 0x29)) ||
                (pxVar3 = xmlStrchr(ret,temp._7_1_), pxVar3 != (xmlChar *)0x0)))) {
              pxStack_28[local_48] = *_out;
              local_48 = local_48 + 1;
            }
            else {
              pxStack_28[local_48] = '%';
              bVar2 = (byte)((int)(uint)temp._7_1_ >> 4);
              if (bVar2 < 10) {
                pxStack_28[local_48 + 1] = bVar2 + 0x30;
              }
              else {
                pxStack_28[local_48 + 1] = bVar2 + 0x37;
              }
              local_48 = local_48 + 2;
              bVar2 = temp._7_1_ & 0xf;
              if (bVar2 < 10) {
                pxStack_28[local_48] = bVar2 + 0x30;
              }
              else {
                pxStack_28[local_48] = bVar2 + 0x37;
              }
              local_48 = iVar1 + 3;
            }
          }
          pxStack_28[local_48] = '\0';
          str_local = pxStack_28;
        }
      }
    }
  }
  return str_local;
}

Assistant:

xmlChar *
xmlURIEscapeStr(const xmlChar *str, const xmlChar *list) {
    xmlChar *ret, ch;
    xmlChar *temp;
    const xmlChar *in;
    int len, out;

    if (str == NULL)
	return(NULL);
    if (str[0] == 0)
	return(xmlStrdup(str));
    len = xmlStrlen(str);
    if (!(len > 0)) return(NULL);

    len += 20;
    ret = (xmlChar *) xmlMallocAtomic(len);
    if (ret == NULL) {
        xmlURIErrMemory("escaping URI value\n");
	return(NULL);
    }
    in = (const xmlChar *) str;
    out = 0;
    while(*in != 0) {
	if (len - out <= 3) {
            temp = xmlSaveUriRealloc(ret, &len);
	    if (temp == NULL) {
                xmlURIErrMemory("escaping URI value\n");
		xmlFree(ret);
		return(NULL);
	    }
	    ret = temp;
	}

	ch = *in;

	if ((ch != '@') && (!IS_UNRESERVED(ch)) && (!xmlStrchr(list, ch))) {
	    unsigned char val;
	    ret[out++] = '%';
	    val = ch >> 4;
	    if (val <= 9)
		ret[out++] = '0' + val;
	    else
		ret[out++] = 'A' + val - 0xA;
	    val = ch & 0xF;
	    if (val <= 9)
		ret[out++] = '0' + val;
	    else
		ret[out++] = 'A' + val - 0xA;
	    in++;
	} else {
	    ret[out++] = *in++;
	}

    }
    ret[out] = 0;
    return(ret);
}